

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O3

char * signal_error_msg(int signal_received,int signal_expected)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  
  __s = (char *)emalloc(100);
  pcVar1 = strsignal(signal_received);
  pcVar1 = strdup(pcVar1);
  pcVar2 = strsignal(signal_expected);
  pcVar2 = strdup(pcVar2);
  if (alarm_received == '\x01') {
    snprintf(__s,100,"Test timeout expired, expected signal %d (%s)",signal_expected,pcVar2);
  }
  else {
    snprintf(__s,100,"Received signal %d (%s), expected %d (%s)",(ulong)(uint)signal_received,pcVar1
             ,signal_expected,pcVar2);
  }
  free(pcVar1);
  free(pcVar2);
  return __s;
}

Assistant:

static char *signal_error_msg(int signal_received, int signal_expected)
{
    char *sig_r_str;
    char *sig_e_str;
    char *msg = (char *)emalloc(MSG_LEN);       /* free'd by caller */

    sig_r_str = strdup(strsignal(signal_received));
    sig_e_str = strdup(strsignal(signal_expected));
    if(alarm_received)
    {
        snprintf(msg, MSG_LEN,
                 "Test timeout expired, expected signal %d (%s)",
                 signal_expected, sig_e_str);
    }
    else
    {
        snprintf(msg, MSG_LEN, "Received signal %d (%s), expected %d (%s)",
                 signal_received, sig_r_str, signal_expected, sig_e_str);
    }
    free(sig_r_str);
    free(sig_e_str);
    return msg;
}